

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O2

void __thiscall DbCheckPostLower::CheckNestedHelperCalls(DbCheckPostLower *this)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *pLVar4;
  Instr *pIVar5;
  Instr **ppIVar6;
  byte bVar7;
  
  ppIVar6 = &this->func->m_headInstr;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  bVar7 = 0;
  pIVar5 = (Instr *)0x0;
  do {
    this_00 = *ppIVar6;
    if (this_00 == (Instr *)0x0) {
      return;
    }
    if ((pIVar5 != (Instr *)0x0) && (pIVar5->m_next != this_00)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,399,"(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if ((this_00->m_kind == InstrKindProfiledLabel) || (this_00->m_kind == InstrKindLabel)) {
      pLVar4 = IR::Instr::AsLabelInstr(this_00);
      bVar7 = (byte)pLVar4->field_0x78 >> 1;
    }
    if (((bVar7 & 1) != 0) && (this_00->m_opcode == CALL)) {
      pIVar5 = this_00;
      bVar2 = IR::Instr::HasLazyBailOut(this_00);
      if (bVar2) {
        EnsureOnlyMovesToRegisterOpnd((DbCheckPostLower *)pIVar5,this_00);
      }
    }
    ppIVar6 = &this_00->m_next;
    pIVar5 = this_00;
  } while( true );
}

Assistant:

void
DbCheckPostLower::CheckNestedHelperCalls()
{
    bool isInHelperBlock = false;
    FOREACH_INSTR_IN_FUNC(instr, this->func)
    {
        if (instr->IsLabelInstr())
        {
            isInHelperBlock = instr->AsLabelInstr()->isOpHelper;
        }

        if (!isInHelperBlock || instr->m_opcode != Js::OpCode::CALL || !instr->HasLazyBailOut())
        {
            continue;
        }

        this->EnsureOnlyMovesToRegisterOpnd(instr);

    } NEXT_INSTR_IN_FUNC;
}